

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPoint *
ON_SubDComponentPoint::BestPickPoint
          (ON_SubDComponentPoint *__return_storage_ptr__,ON_PickType pick_type,
          double vertex_depth_bias,double edge_depth_bias,ON_SubDComponentPoint *A,
          ON_SubDComponentPoint *B)

{
  double dVar1;
  Type a;
  Type b;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  ON_SubDComponentPoint *local_120;
  ON_SubDComponentPoint *local_110;
  ON_SubDComponentPoint *local_108;
  ON_SubDComponentPoint *best;
  Type best_type;
  int biased_compare;
  bool bHaveFace;
  bool bHaveEdge;
  bool bHaveVertex;
  double depth_bias;
  double distance_tol;
  ON_PickPoint biased_B;
  ON_PickPoint biased_A;
  int type_bias;
  Type B_component_type;
  Type A_component_type;
  int unbiased_compare;
  ON_SubDComponentPoint *B_local;
  ON_SubDComponentPoint *A_local;
  double edge_depth_bias_local;
  double vertex_depth_bias_local;
  ON_PickType pick_type_local;
  
  iVar4 = ON_PickPoint::Compare(&A->m_pick_point,&B->m_pick_point);
  iVar5 = -1;
  if (-1 < iVar4) {
    iVar5 = 1;
  }
  a = ON_SubDComponentPtr::ComponentType(&A->m_component_ptr);
  b = ON_SubDComponentPtr::ComponentType(&B->m_component_ptr);
  if (a == b) {
    local_108 = B;
    if (-1 < iVar5) {
      local_108 = A;
    }
    memcpy(__return_storage_ptr__,local_108,0x50);
    return __return_storage_ptr__;
  }
  if (a == Unset) {
    memcpy(__return_storage_ptr__,B,0x50);
    return __return_storage_ptr__;
  }
  if (b != Unset) {
    iVar4 = ON_SubDComponentPtr::CompareComponentPtrType(a,b);
    iVar5 = -1;
    if (iVar4 < 1) {
      iVar5 = 1;
    }
    if (pick_type == PointPick) {
      if (iVar5 < 0) {
        bVar2 = Internal_FirstIsPartOfSecond(B,A);
      }
      else {
        bVar2 = Internal_FirstIsPartOfSecond(A,B);
      }
      if (((bVar2) && (a != Face)) && (b != Face)) {
        local_110 = B;
        if (-1 < iVar5) {
          local_110 = A;
        }
        memcpy(__return_storage_ptr__,local_110,0x50);
        dVar1 = ON_Min((A->m_pick_point).m_distance,(B->m_pick_point).m_distance);
        (__return_storage_ptr__->m_pick_point).m_distance = dVar1;
        dVar1 = ON_Max((A->m_pick_point).m_depth,(B->m_pick_point).m_depth);
        (__return_storage_ptr__->m_pick_point).m_depth = dVar1;
        return __return_storage_ptr__;
      }
    }
    memcpy(&biased_B.m_distance,&A->m_pick_point,0x48);
    memcpy(&distance_tol,&B->m_pick_point,0x48);
    if (((pick_type == PointPick) && (iVar5 < 0)) &&
       ((0.0 < biased_B.m_depth && (biased_B.m_depth <= 1.0)))) {
      biased_B.m_depth = 0.0;
    }
    _biased_compare = 0.0;
    dVar1 = _biased_compare;
    if (((a != Vertex && b != Vertex) || (vertex_depth_bias <= 0.0)) ||
       (1.23432101234321e+308 <= vertex_depth_bias)) {
      if (((((a == Edge || b == Edge) && (a == Face || b == Face)) && (0.0 < edge_depth_bias)) &&
          ((edge_depth_bias < 1.23432101234321e+308 &&
           (bVar2 = Internal_FirstIsPartOfSecond(A,B), dVar1 = edge_depth_bias, !bVar2)))) &&
         (bVar2 = Internal_FirstIsPartOfSecond(B,A), dVar1 = _biased_compare, bVar2)) {
        biased_B.m_t[3] = edge_depth_bias + biased_B.m_t[3];
        dVar1 = edge_depth_bias;
      }
    }
    else {
      bVar2 = Internal_FirstIsPartOfSecond(A,B);
      dVar1 = vertex_depth_bias;
      if ((!bVar2) && (bVar2 = Internal_FirstIsPartOfSecond(B,A), dVar1 = _biased_compare, bVar2)) {
        biased_B.m_t[3] = vertex_depth_bias + biased_B.m_t[3];
        dVar1 = vertex_depth_bias;
      }
    }
    _biased_compare = dVar1;
    iVar4 = ON_PickPoint::Compare
                      ((ON_PickPoint *)&biased_B.m_distance,(ON_PickPoint *)&distance_tol);
    iVar5 = -1;
    if (-1 < iVar4) {
      iVar5 = 1;
    }
    local_120 = B;
    if (-1 < iVar5) {
      local_120 = A;
    }
    memcpy(__return_storage_ptr__,local_120,0x50);
    TVar3 = ON_SubDComponentPtr::ComponentType(&__return_storage_ptr__->m_component_ptr);
    if (((TVar3 == Vertex) || ((TVar3 == Edge && (a == Face || b == Face)))) &&
       (ABS((A->m_pick_point).m_depth - (B->m_pick_point).m_depth) <= _biased_compare)) {
      dVar1 = ON_Min((A->m_pick_point).m_distance,(B->m_pick_point).m_distance);
      (__return_storage_ptr__->m_pick_point).m_distance = dVar1;
      dVar1 = ON_Max((A->m_pick_point).m_depth,(B->m_pick_point).m_depth);
      (__return_storage_ptr__->m_pick_point).m_depth = dVar1;
    }
    return __return_storage_ptr__;
  }
  memcpy(__return_storage_ptr__,A,0x50);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentPoint ON_SubDComponentPoint::BestPickPoint(
  ON_PickType pick_type,
  double vertex_depth_bias,
  double edge_depth_bias,
  const ON_SubDComponentPoint& A,
  const ON_SubDComponentPoint& B
)
{
  // If you're working on a bug where somebody isn't able to pick the SubD component
  // they thought they clicked on, then you're in the right place.
  // Mikko has done lots of work in this area and be sure to retest RH-52172 and RH-52173 (fixed 3 May 2019).
  // Also, retest RH-59666 (fixed August 2020).
  //
  // This function will be a work in progress for many years.

  // unbiased_compare ignores SubD component types and relative topological relationships.
  // If unbiased_compare == 1, then A is "best" from this "unbiased" point of views.
  const int unbiased_compare = (ON_PickPoint::Compare(A.m_pick_point, B.m_pick_point)>=0) ? 1 : -1;
  
  const ON_SubDComponentPtr::Type A_component_type = A.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type B_component_type = B.m_component_ptr.ComponentType();
  if (A_component_type == B_component_type)
  {
    // A and B are the same type of component
    return (unbiased_compare >= 0) ? A : B;
  }
  if (ON_SubDComponentPtr::Type::Unset == A_component_type)
    return B;
  if (ON_SubDComponentPtr::Type::Unset == B_component_type)
    return A;

  // If we get this far, then A and B are pick events on different types of SubD components.

  // type_bias = 1 if A is a vertex and B is an edge/face or A is an edge and B is a face.
  // type_bias = -1 if B is a vertex and A is an edge/face or B is an edge and A is a face.
  const int type_bias = (ON_SubDComponentPtr::CompareComponentPtrType(A_component_type, B_component_type)) <= 0 ? 1 : -1;

  // 17 Dec 2024, Mikko, RH-85024:
  // Skip the following section if either component is a face. 
  // In that case it gives the wrong answer if you click on an opaque shaded SubD face, 
  // and at the same time hit an edge/vertex of the same face behind the shaded part.
  if (
    ON_PickType::PointPick == pick_type
    && ((type_bias >= 0) ? Internal_FirstIsPartOfSecond(A, B) : Internal_FirstIsPartOfSecond(B, A))
    && ON_SubDComponentPtr::Type::Face != A_component_type
    && ON_SubDComponentPtr::Type::Face != B_component_type
    )
  {
    // A point pick is occurring and best is a vertex on an edge/face or best is an edge on a face.
    // Bias towards the vertex/edge.
    // Users can pick the middle of an edge/face if they want the "bigger" component.
    ON_SubDComponentPoint best = (type_bias >= 0) ? A : B;
    best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
    best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    return best;
  }

  ON_PickPoint biased_A(A.m_pick_point);
  ON_PickPoint biased_B(B.m_pick_point);

  // distance bias applied to point picks on vertices and edges
  // Events with smaller distances are "better" because they are visually are closer to the picked point.
  if (ON_PickType::PointPick == pick_type)
  {
    // 18 Aug 2020 Dale Lear:
    //   The pick distance for a point pick is normalized so 1.0 = pick frustum radius. 
    //   Reasonable values for distance_tol are 0.25 to 1.0.
    //   0.5 fixes RH-52172
    //   1.0 seems to fix bugs like RH-59666 (0.5 is too small to fix RH-59666).
    const double distance_tol = 1.0;

    if ( type_bias > 0 && biased_A.m_distance > 0.0 && biased_A.m_distance <= distance_tol)
      biased_A.m_distance = 0.0; // consider pick A to be on the vertex/edge

    if ( type_bias < 0 && biased_B.m_distance > 0.0 && biased_B.m_distance <= distance_tol )
      biased_B.m_distance = 0.0; // consider pick B to be on the vertex/edge
  }

  // Apply a depth bias when we have a relative topological relationship between the components
  // (vertex on edge, vertex on face, or edge on face).
  // Events with larger depths are "better" because they are in front of smaller depths.
  double depth_bias = 0.0;
  const bool bHaveVertex = ON_SubDComponentPtr::Type::Vertex == A_component_type || ON_SubDComponentPtr::Type::Vertex == B_component_type;
  const bool bHaveEdge = ON_SubDComponentPtr::Type::Edge == A_component_type || ON_SubDComponentPtr::Type::Edge == B_component_type;
  const bool bHaveFace = ON_SubDComponentPtr::Type::Face == A_component_type || ON_SubDComponentPtr::Type::Face == B_component_type;
  if ( bHaveVertex && vertex_depth_bias > 0.0 && vertex_depth_bias < ON_UNSET_POSITIVE_VALUE  )
  {
    // One event is a vertex, the other event is an edge or face, and a vertex bias was supplied.
    // Test to see if the vertex is on the edge or face.
    if (Internal_FirstIsPartOfSecond(A,B))
    {
      // B is an edge/face and A is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_A.m_depth += depth_bias; // bias vertex closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is an edge/face and B is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_B.m_depth += depth_bias; // bias vertex closer
    }
  }
  else if ( bHaveEdge && bHaveFace && edge_depth_bias > 0.0  && edge_depth_bias < ON_UNSET_POSITIVE_VALUE )
  {
    // One event is an edge, the other event is a face, and an edge bias was supplied.
    // Test to see if the edge is on the face.
    if (Internal_FirstIsPartOfSecond(A, B))
    {
      // B is a face and A is an edge on the face
      depth_bias = edge_depth_bias;
      biased_A.m_depth += depth_bias; // bias edge closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is a face and B is an edge on the face
      depth_bias = edge_depth_bias;
      biased_B.m_depth += depth_bias; // bias edge closer
    }
  }

  // biased_compare adds a bias towards vertices and edges based on SubD component types and relative topological relationships.
  // If biased_compare >= 0, then A is "best" from this biased point of views.
  const int biased_compare = (ON_PickPoint::Compare(biased_A, biased_B)>=0) ? 1 : -1;

  ON_SubDComponentPoint best = (biased_compare >= 0) ? A : B;

  const ON_SubDComponentPtr::Type best_type = best.m_component_ptr.ComponentType();
  if ( ON_SubDComponentPtr::Type::Vertex == best_type || (ON_SubDComponentPtr::Type::Edge == best_type && bHaveFace) )
  {
    // Either a vertex was better than an edge/face or an edge was better than a face.
    if (fabs(A.m_pick_point.m_depth - B.m_pick_point.m_depth) <= depth_bias)
    {
      // The two pick points were "close" in depth.
      // In these cases, strengthen "best" by using the "best" depth and distance values from A and B.
      best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
      best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    }
  }

  return best;
}